

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresdata.cpp
# Opt level: O1

UChar * res_getAlias_63(ResourceData *pResData,Resource res,int32_t *pLength)

{
  anon_struct_8_3_a62c8074 *paVar1;
  UChar *pUVar2;
  int32_t iVar3;
  
  if ((res & 0xf0000000) == 0x30000000) {
    if ((res & 0xfffffff) == 0) {
      paVar1 = &gEmptyString;
    }
    else {
      paVar1 = (anon_struct_8_3_a62c8074 *)((ulong)((res & 0xfffffff) << 2) + (long)pResData->pRoot)
      ;
    }
    iVar3 = paVar1->length;
    pUVar2 = &paVar1->nul;
  }
  else {
    iVar3 = 0;
    pUVar2 = (UChar *)0x0;
  }
  if (pLength != (int32_t *)0x0) {
    *pLength = iVar3;
  }
  return pUVar2;
}

Assistant:

U_CAPI const UChar * U_EXPORT2
res_getAlias(const ResourceData *pResData, Resource res, int32_t *pLength) {
    const UChar *p;
    uint32_t offset=RES_GET_OFFSET(res);
    int32_t length;
    if(RES_GET_TYPE(res)==URES_ALIAS) {
        const int32_t *p32= offset==0 ? &gEmptyString.length : pResData->pRoot+offset;
        length=*p32++;
        p=(const UChar *)p32;
    } else {
        p=NULL;
        length=0;
    }
    if(pLength) {
        *pLength=length;
    }
    return p;
}